

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O1

SharedPtr<Decorator> __thiscall
Rml::DecoratorTextInstancer::InstanceDecorator
          (DecoratorTextInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *param_3)

{
  long lVar1;
  Array<const_Property_*,_2> p_position;
  Property *this_00;
  Property *this_01;
  Property *pPVar2;
  Property *pPVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  SharedPtr<Decorator> SVar8;
  SharedPtr<Rml::DecoratorText> decorator;
  String text;
  undefined1 local_a9;
  uint local_a8;
  Unit local_a4;
  Colour<unsigned_char,_255,_false> in_stack_ffffffffffffff60;
  Colour<unsigned_char,_255,_false> CVar9;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  String local_80;
  Vector2Numeric local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[9]);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[10]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,param_1[3].field_2._M_local_buf[0xb]);
  if ((pPVar2 == (Property *)0x0 || (this_01 == (Property *)0x0 || this_00 == (Property *)0x0)) ||
      pPVar3 == (Property *)0x0) {
    (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
    (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    Property::Get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff60,this_00);
    StringUtilities::DecodeRml
              (&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff60);
    _Var4._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      local_90._M_allocated_capacity + 1);
      _Var4._M_pi = extraout_RDX_01;
    }
    if (local_80._M_string_length == 0) {
      (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
      (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_a4 = this_01->unit;
      if (local_a4 == COLOUR) {
        in_stack_ffffffffffffff60.red = '\0';
        in_stack_ffffffffffffff60.green = '\0';
        in_stack_ffffffffffffff60.blue = '\0';
        in_stack_ffffffffffffff60.alpha = 0xff;
        Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
                  (&this_01->value,(Colour<unsigned_char,_255,_false> *)&stack0xffffffffffffff60);
        local_a8 = (uint)in_stack_ffffffffffffff60 & 0xff;
        uVar6 = (uint)in_stack_ffffffffffffff60 & 0xff000000;
        uVar5 = (uint)in_stack_ffffffffffffff60 & 0xff0000;
        uVar7 = (uint)in_stack_ffffffffffffff60 & 0xff00;
      }
      else {
        uVar5 = 0;
        uVar6 = 0xff000000;
        uVar7 = 0;
        local_a8 = 0;
      }
      p_position._M_elems[0]._4_4_ = in_stack_ffffffffffffff64;
      p_position._M_elems[0]._0_4_ = in_stack_ffffffffffffff60;
      p_position._M_elems[1] = (Property *)in_stack_ffffffffffffff68._M_pi;
      local_60 = ComputePosition(p_position);
      CVar9.red = '\0';
      CVar9.green = '\0';
      CVar9.blue = '\0';
      CVar9.alpha = '\0';
      uVar10 = 0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Rml::DecoratorText,std::allocator<Rml::DecoratorText>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff68,
                 (DecoratorText **)&stack0xffffffffffffff60,
                 (allocator<Rml::DecoratorText> *)&local_a9);
      lVar1 = CONCAT44(uVar10,CVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        local_40._8_8_ = local_80.field_2._8_8_;
        local_50 = &local_40;
      }
      else {
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_80._M_dataplus._M_p;
      }
      local_40._M_allocated_capacity._1_7_ = local_80.field_2._M_allocated_capacity._1_7_;
      local_40._M_local_buf[0] = local_80.field_2._M_local_buf[0];
      local_48 = local_80._M_string_length;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      uVar7 = uVar7 | local_a8;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      ::std::__cxx11::string::operator=((string *)(lVar1 + 0x30),(string *)&local_50);
      *(bool *)(lVar1 + 0x50) = local_a4 == KEYWORD;
      *(uint *)(lVar1 + 0x51) = uVar7 | uVar5 | uVar6;
      *(NumericValue *)(lVar1 + 0x58) = local_60.x;
      *(NumericValue *)(lVar1 + 0x60) = local_60.y;
      _Var4._M_pi = extraout_RDX_02;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
        _Var4._M_pi = extraout_RDX_03;
      }
      (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
           (_func_int **)CONCAT44(uVar10,CVar9);
      (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff68._M_pi;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
      _Var4._M_pi = extraout_RDX_04;
    }
  }
  SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar8.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTextInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& /*instancer_interface*/)
{
	const Property* p_text = properties.GetProperty(ids.text);
	const Property* p_color = properties.GetProperty(ids.color);
	Array<const Property*, 2> p_align = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};
	if (!p_text || !p_color || !p_align[0] || !p_align[1])
		return nullptr;

	String text = StringUtilities::DecodeRml(p_text->Get<String>());
	if (text.empty())
		return nullptr;

	const bool inherit_color = (p_color->unit == Unit::KEYWORD);
	const Colourb color = (p_color->unit == Unit::COLOUR ? p_color->Get<Colourb>() : Colourb{});
	const Vector2Numeric align = ComputePosition(p_align);

	auto decorator = MakeShared<DecoratorText>();
	decorator->Initialise(std::move(text), inherit_color, color, align);
	return decorator;
}